

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAndiRg<(moira::Instr)10,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 n;
  uint op1;
  ushort in_SI;
  Moira *in_RDI;
  u32 result;
  int dst;
  u32 src;
  u32 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffe8;
  u32 uVar1;
  undefined2 in_stack_fffffffffffffff4;
  
  n = readI<(moira::Size)2>(in_RDI);
  op1 = in_SI & 7;
  uVar1 = n;
  readD<(moira::Size)2>(in_RDI,n);
  logic<(moira::Instr)10,(moira::Size)2>
            ((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar1)),op1,
             in_stack_ffffffffffffffe8);
  prefetch<4ul>(in_RDI);
  writeD<(moira::Size)2>(in_RDI,n,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void
Moira::execAndiRg(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 result = logic<I,S>(src, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(4);
    writeD<S>(dst, result);
}